

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

reverse_iterator * __thiscall
llvm::sys::path::rbegin
          (reverse_iterator *__return_storage_ptr__,path *this,StringRef Path,Style style)

{
  reverse_iterator *__src;
  undefined1 local_58 [8];
  reverse_iterator I;
  path *ppStack_20;
  Style style_local;
  StringRef Path_local;
  
  Path_local.Data = Path.Data;
  I._44_4_ = Path.Length._0_4_;
  ppStack_20 = this;
  reverse_iterator::reverse_iterator((reverse_iterator *)local_58);
  local_58 = (undefined1  [8])ppStack_20;
  I.Path.Data = Path_local.Data;
  Path_local.Length = (size_t)&stack0xffffffffffffffe0;
  I.Component.Length = (size_t)Path_local.Data;
  I.Position._0_4_ = I._44_4_;
  __src = reverse_iterator::operator++((reverse_iterator *)local_58);
  memcpy(__return_storage_ptr__,__src,0x30);
  return __return_storage_ptr__;
}

Assistant:

reverse_iterator rbegin(StringRef Path, Style style) {
  reverse_iterator I;
  I.Path = Path;
  I.Position = Path.size();
  I.S = style;
  return ++I;
}